

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_2_mips64el
               (TCGContext_conflict6 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz,GVecGen2_conflict6 *g)

{
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict6 *p_Var1;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict6 *p_Var2;
  TCGType TVar3;
  TCGv_i64 ret;
  uint uVar4;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_conflict6 *)0x0) {
switchD_00899efa_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var1 = g->fni8, p_Var1 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_conflict6 *)0x0)) {
      ret = tcg_temp_new_i64(tcg_ctx);
      for (uVar4 = 0; uVar4 < oprsz; uVar4 = uVar4 + 8) {
        tcg_gen_ld_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(aofs + uVar4));
        (*p_Var1)(tcg_ctx,ret,ret);
        tcg_gen_st_i64_mips64el(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar4));
      }
    }
    else {
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var2 = g->fni4, p_Var2 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_conflict6 *)0x0))
      {
        if (g->fno != (gen_helper_gvec_2_conflict6 *)0x0) {
          tcg_gen_gvec_2_ool_mips64el(tcg_ctx,dofs,aofs,oprsz,maxsz,g->data,g->fno);
          return;
        }
        __assert_fail("g->fno != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                      ,0x42f,
                      "void tcg_gen_gvec_2_mips64el(TCGContext *, uint32_t, uint32_t, uint32_t, uint32_t, const GVecGen2 *)"
                     );
      }
      ret = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      for (uVar4 = 0; uVar4 < oprsz; uVar4 = uVar4 + 4) {
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,(ulong)(aofs + uVar4));
        (*p_Var2)(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)ret);
        tcg_gen_st_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,(ulong)(dofs + uVar4));
      }
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  else {
    TVar3 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
    switch(TVar3) {
    case TCG_TYPE_I32:
      goto switchD_00899efa_caseD_0;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                 ,0x436,(char *)0x0);
    case TCG_TYPE_V64:
      expand_2_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz,8,TCG_TYPE_V64,g->fniv);
      break;
    case TCG_TYPE_V256:
      uVar4 = oprsz & 0xffffffe0;
      expand_2_vec(tcg_ctx,(uint)g->vece,dofs,aofs,uVar4,0x20,TCG_TYPE_V256,g->fniv);
      if (uVar4 == oprsz) break;
      dofs = dofs + uVar4;
      aofs = aofs + uVar4;
      oprsz = oprsz & 0x1f;
      maxsz = maxsz - uVar4;
    case TCG_TYPE_V128:
      expand_2_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz,0x10,TCG_TYPE_V128,g->fniv);
    }
  }
  if (maxsz < oprsz || maxsz - oprsz == 0) {
    return;
  }
  expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
  return;
}

Assistant:

void tcg_gen_gvec_2(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs,
                    uint32_t oprsz, uint32_t maxsz, const GVecGen2 *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_2_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_2_i64(tcg_ctx, dofs, aofs, oprsz, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_2_i32(tcg_ctx, dofs, aofs, oprsz, g->fni4);
        } else {
            assert(g->fno != NULL);
            tcg_gen_gvec_2_ool(tcg_ctx, dofs, aofs, oprsz, maxsz, g->data, g->fno);
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}